

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

uint32_t compute_self_register
                   (gvisitor_t *self,ircode_t *code,gnode_t *node,uint32_t target_register,
                   gnode_r *list)

{
  _Bool _Var1;
  gravity_class_t *pgVar2;
  uint32_t local_9c;
  bool local_81;
  gnode_t *local_80;
  gnode_t *local_78;
  size_t local_70;
  uint16_t local_62;
  uint32_t local_60;
  uint16_t local_index;
  uint32_t reg;
  uint32_t uStack_54;
  uint16_t i;
  uint32_t target;
  uint32_t dest;
  gnode_identifier_expr_t *expr;
  gnode_t *pgStack_40;
  _Bool next_is_access;
  gnode_postfix_subexpr_t *next;
  gnode_r *list_local;
  gnode_t *pgStack_28;
  uint32_t target_register_local;
  gnode_t *node_local;
  ircode_t *code_local;
  gvisitor_t *self_local;
  
  if ((((node == (gnode_t *)0x0) || (node->tag != NODE_IDENTIFIER_EXPR)) ||
      (node[1].token.colno != 3)) ||
     ((*(short *)((long)&node[1].token.position + 2) != 0 || ((short)node[1].token.position != -1)))
     ) {
    if ((node == (gnode_t *)0x0) ||
       ((node->tag != NODE_KEYWORD_EXPR || ((node->token).type != TOK_KEY_SUPER)))) {
      if (list == (gnode_r *)0x0) {
        local_70 = 0;
      }
      else {
        local_70 = list->n;
      }
      if (local_70 == 0) {
        local_80 = (gnode_t *)0x0;
      }
      else {
        if (list->n == 0) {
          local_78 = (gnode_t *)0x0;
        }
        else {
          local_78 = *list->p;
        }
        local_80 = local_78;
      }
      pgStack_40 = local_80;
      local_81 = false;
      if (local_80 != (gnode_t *)0x0) {
        local_81 = local_80->tag == NODE_ACCESS_EXPR;
      }
      expr._7_1_ = local_81;
      next = (gnode_postfix_subexpr_t *)list;
      list_local._4_4_ = target_register;
      pgStack_28 = node;
      node_local = (gnode_t *)code;
      code_local = (ircode_t *)self;
      if ((((node == (gnode_t *)0x0) || (node->tag != NODE_IDENTIFIER_EXPR)) ||
          (node[1].token.colno != 4)) || (local_81 != false)) {
        local_62 = 0;
        _Var1 = node_is_closure(node,&local_62);
        if (_Var1) {
          if ((expr._7_1_ & 1) != 0) {
            return (uint)local_62;
          }
          pgVar2 = context_get_class((gvisitor_t *)code_local);
          if (pgVar2 != (gravity_class_t *)0x0) {
            return 0;
          }
        }
        self_local._4_4_ = list_local._4_4_;
      }
      else {
        _target = node;
        uStack_54 = ircode_register_push_temp(code);
        reg = 0;
        for (local_index = 0; local_index < *(ushort *)((long)&_target[1].token.position + 2);
            local_index = local_index + 1) {
          if (pgStack_28 == (gnode_t *)0x0) {
            local_9c = 0;
          }
          else {
            local_9c = (_target->token).lineno;
          }
          ircode_add((ircode_t *)node_local,LOAD,uStack_54,reg,0x100,local_9c);
          reg = uStack_54;
        }
        local_60 = ircode_register_pop_context_protect((ircode_t *)node_local,true);
        self_local._4_4_ = local_60;
        if (local_60 == 0xffffffff) {
          report_error((gvisitor_t *)code_local,pgStack_28,"Unexpected register error.");
          self_local._4_4_ = 0xffffffff;
        }
      }
    }
    else {
      self_local._4_4_ = 0;
    }
  }
  else {
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

static uint32_t compute_self_register (gvisitor_t *self, ircode_t *code, gnode_t *node, uint32_t target_register, gnode_r *list) {
    DEBUG_CODEGEN("compute_self_register");

    // check for special implicit self slot
    if (IS_IMPLICIT_SELF(node)) return 0;

    // check for super keyword
    if (IS_SUPER(node)) return 0;

    // examine next node in list
    gnode_postfix_subexpr_t *next = (gnode_array_size(list) > 0) ? (gnode_postfix_subexpr_t *)gnode_array_get(list, 0) : NULL;
    bool next_is_access = (next && next->base.tag == NODE_ACCESS_EXPR);

    // if node refers to an outer class then load outer class from hidden _outer ivar and return its register
    if ((NODE_ISA(node, NODE_IDENTIFIER_EXPR) && ((gnode_identifier_expr_t *)node)->location.type == LOCATION_CLASS_IVAR_OUTER) && !next_is_access) {
        gnode_identifier_expr_t *expr = (gnode_identifier_expr_t *)node;
        uint32_t dest = ircode_register_push_temp(code);
        uint32_t target = 0;

        for (uint16_t i=0; i<expr->location.nup; ++i) {
			ircode_add(code, LOAD, dest, target, 0 + MAX_REGISTERS, LINE_NUMBER(expr));
            target = dest;
        }

        uint32_t reg = ircode_register_pop_context_protect(code, true);
        if (reg == REGISTER_ERROR) {
            report_error(self, node, "Unexpected register error.");
            return UINT32_MAX;
        }

        return reg;
    }

    // no special register found
    // check if node is a closure defined inside a class context (so self is needed)
    uint16_t local_index = 0;
    if (node_is_closure(node, &local_index)) {
        if (next_is_access) return local_index;
        if (context_get_class(self) != NULL) return 0;
    }
    
    // default case is to return the target register
    return target_register;
}